

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O1

bool djgt_save_bmp(djg_texture *texture,char *filename)

{
  djg_texture *pdVar1;
  int iVar2;
  ulong uVar3;
  bool bVar4;
  char buf [1024];
  char acStack_438 [1032];
  
  pdVar1 = texture->next;
  iVar2 = 2;
  do {
    texture = texture->next;
    iVar2 = iVar2 + -1;
  } while (texture != (djg_texture *)0x0);
  if (iVar2 == 0) {
    sprintf(acStack_438,"%s.bmp",filename);
    iVar2 = stbi_write_bmp(acStack_438,pdVar1->x,pdVar1->y,pdVar1->comp,pdVar1->texels);
    bVar4 = iVar2 != 0;
  }
  else {
    bVar4 = pdVar1 == (djg_texture *)0x0;
    if (!bVar4) {
      uVar3 = 1;
      do {
        sprintf(acStack_438,"%s_layer%03i.bmp",filename,uVar3);
        uVar3 = (ulong)((int)uVar3 + 1);
        iVar2 = stbi_write_bmp(acStack_438,pdVar1->x,pdVar1->y,pdVar1->comp,pdVar1->texels);
      } while (iVar2 != 0);
    }
  }
  return bVar4;
}

Assistant:

bool djgt_save_bmp(const djg_texture *texture, const char *filename)
{
    const djg_texture* it = texture->next;
    int cnt = djgt__count(texture);
    char buf[1024];

    if (cnt == 1) {
        sprintf(buf, "%s.bmp", filename);

        return stbi_write_bmp(buf, it->x, it->y, it->comp, it->texels);
    } else {
        int i = 1;

        while (it) {
            sprintf(buf, "%s_layer%03i.bmp", filename, i);

            ++i;
            if (!stbi_write_bmp(buf, it->x, it->y, it->comp, it->texels))
                return false;
        }
    }

    return true;
}